

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniOutputFlag_Test::TestBody(TApp_IniOutputFlag_Test *this)

{
  App *this_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *m;
  NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_01;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_02;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_03;
  char *pcVar1;
  long lVar2;
  allocator local_2f9;
  AssertionResult gtest_ar;
  string local_2e8;
  string local_2c8;
  int q;
  int v;
  string str;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  string local_200;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"--simple",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_2e8);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_40,&v,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"--nothing",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_2e8);
  CLI::App::add_flag(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"--onething",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_e0,"",(allocator *)&local_2e8);
  CLI::App::add_flag(this_00,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_100,"--something",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_120,"",(allocator *)&local_2e8);
  CLI::App::add_flag<int,_(CLI::detail::enabler)0>(this_00,&local_100,&q,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string((string *)&str,"--simple=3",(allocator *)&local_2e8);
  std::__cxx11::string::string(local_280,"--onething",(allocator *)&local_2c8);
  std::__cxx11::string::string(local_260,"--something",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_240,"--something",&local_2f9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&str,&local_220);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string(local_280 + lVar2 + -0x20);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  TApp::run(&this->super_TApp);
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_140,"",(allocator *)&local_2e8);
  CLI::App::config_to_str(&str,this_00,false,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string((string *)&local_2c8,"simple=3",&local_2f9);
  testing::HasSubstr(&local_160,&local_2c8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2e8,(internal *)&local_160,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_2c8,"nothing",&local_2f9);
  testing::HasSubstr(&local_1a0,&local_2c8);
  testing::
  Not<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_180,(testing *)&local_1a0,m);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
            ((PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_2e8,(internal *)&local_180,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(&gtest_ar,(char *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_2c8,"onething=true",&local_2f9);
  testing::HasSubstr(&local_1c0,&local_2c8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2e8,(internal *)&local_1c0,matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_2c8,"something=2",&local_2f9);
  testing::HasSubstr(&local_1e0,&local_2c8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2e8,(internal *)&local_1e0,matcher_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_200,"",(allocator *)&local_2c8);
  CLI::App::config_to_str(&local_2e8,this_00,true,&local_200);
  std::__cxx11::string::operator=((string *)&str,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_2c8,"nothing",&local_2f9);
  testing::HasSubstr(&local_220,&local_2c8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2e8,(internal *)&local_220,matcher_03);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_2e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x262,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST_F(TApp, IniOutputFlag) {

    int v, q;
    app.add_option("--simple", v);
    app.add_flag("--nothing");
    app.add_flag("--onething");
    app.add_flag("--something", q);

    args = {"--simple=3", "--onething", "--something", "--something"};

    run();

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("simple=3"));
    EXPECT_THAT(str, Not(HasSubstr("nothing")));
    EXPECT_THAT(str, HasSubstr("onething=true"));
    EXPECT_THAT(str, HasSubstr("something=2"));

    str = app.config_to_str(true);
    EXPECT_THAT(str, HasSubstr("nothing"));
}